

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O2

void getcolormap(nn_quant *nnq,uchar *map)

{
  long lVar1;
  ulong uVar2;
  
  for (lVar1 = 0; lVar1 < nnq->netsize; lVar1 = lVar1 + 1) {
    for (uVar2 = 3; -1 < (int)uVar2; uVar2 = (ulong)((int)uVar2 - 1)) {
      *map = (uchar)nnq->network[lVar1][uVar2];
      map = map + 1;
    }
  }
  return;
}

Assistant:

void getcolormap(nnq, map)
nn_quant *nnq;
unsigned char *map;
{
	int i,j;
	for(j=0; j < nnq->netsize; j++) {
		for (i=3; i>=0; i--) {
			*map = nnq->network[j][i];
			map++;
		}
	}
}